

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistoryTrackerTests.cpp
# Opt level: O3

void __thiscall
solitaire::archivers::HistoryTrackerTests_onSaveShouldThrowIfPassedNullptr_Test::TestBody
          (HistoryTrackerTests_onSaveShouldThrowIfPassedNullptr_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  _Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false> local_68;
  AssertHelper local_60;
  long *local_58;
  char *local_50;
  long local_48 [2];
  Message local_38 [4];
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_50 = (char *)0x0;
  local_58 = local_48;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_68._M_head_impl = (Snapshot *)0x0;
    HistoryTracker::save
              (&(this->super_HistoryTrackerTests).historyTracker,
               (unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                *)&local_68);
    if (local_68._M_head_impl != (Snapshot *)0x0) {
      (*(local_68._M_head_impl)->_vptr_Snapshot[1])();
    }
    local_68._M_head_impl = (Snapshot *)0x0;
  }
  std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x2796cf);
  testing::Message::Message(local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/archivers/HistoryTrackerTests.cpp"
             ,0x1c,(char *)local_58);
  testing::internal::AssertHelper::operator=(&local_60,local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (local_38[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

TEST_F(HistoryTrackerTests, onSaveShouldThrowIfPassedNullptr) {
    EXPECT_THROW(historyTracker.save(nullptr), std::runtime_error);
}